

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAffinity.cxx
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  undefined1 local_40 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> cpus;
  
  cpus._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  cmAffinity::GetProcessorsAvailable();
  bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::empty
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )local_40);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"CPU affinity not supported on this platform.\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"CPU affinity mask count is \'");
    sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_40);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,"\'.\n");
  }
  cpus._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_40);
  return cpus._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main()
{
  std::set<size_t> cpus = cmAffinity::GetProcessorsAvailable();
  if (!cpus.empty()) {
    std::cout << "CPU affinity mask count is '" << cpus.size() << "'.\n";
  } else {
    std::cout << "CPU affinity not supported on this platform.\n";
  }
  return 0;
}